

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void __thiscall Liby::TimerQueue::destroy(TimerQueue *this)

{
  this->timerfd_ = -1;
  std::__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_>::reset
            ((__uniq_ptr_impl<Liby::Channel,_std::default_delete<Liby::Channel>_> *)
             &this->timerChan_,(pointer)0x0);
  BinaryHeap<Liby::WeakTimerHolder>::clear(&this->queue_);
  return;
}

Assistant:

void TimerQueue::destroy() {
#ifdef __linux__
    timerfd_ = -1;
    timerChan_.reset();
#endif
    queue_.clear();
}